

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O0

OptionBase<Inferences::ALASCA::FourierMotzkinConf::Rhs> * __thiscall
Lib::OptionBase<Inferences::ALASCA::FourierMotzkinConf::Rhs>::operator=
          (OptionBase<Inferences::ALASCA::FourierMotzkinConf::Rhs> *this,
          OptionBase<Inferences::ALASCA::FourierMotzkinConf::Rhs> *other)

{
  byte *in_RSI;
  OptionBase<Inferences::ALASCA::FourierMotzkinConf::Rhs> *in_RDI;
  MaybeUninit<Inferences::ALASCA::FourierMotzkinConf::Rhs> *this_00;
  EVP_PKEY_CTX local_40 [48];
  byte *local_10;
  
  local_10 = in_RSI;
  if ((in_RDI->_isSome & 1U) != 0) {
    unwrap((OptionBase<Inferences::ALASCA::FourierMotzkinConf::Rhs> *)0x424877);
    Inferences::ALASCA::FourierMotzkinConf::Rhs::~Rhs((Rhs *)0x42487f);
  }
  if ((*local_10 & 1) != 0) {
    this_00 = &in_RDI->_elem;
    unwrap((OptionBase<Inferences::ALASCA::FourierMotzkinConf::Rhs> *)0x4248a0);
    move_if_value<Inferences::ALASCA::FourierMotzkinConf::Rhs,_true>((Rhs *)this_00);
    MaybeUninit<Inferences::ALASCA::FourierMotzkinConf::Rhs>::init(this_00,local_40);
    Inferences::ALASCA::FourierMotzkinConf::Rhs::~Rhs((Rhs *)0x4248cc);
  }
  in_RDI->_isSome = (bool)(*local_10 & 1);
  return in_RDI;
}

Assistant:

OptionBase& operator=(OptionBase&& other)
  {
    if (_isSome) {
      unwrap().~A();
    }
    if (other._isSome) {
      _elem.init(move_if_value<A>(other.unwrap()));
    }
    _isSome = other._isSome;
    return *this;
  }